

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

int flatcc_builder_check_required(flatcc_builder_t *B,flatbuffers_voffset_t *required,int count)

{
  int local_28;
  int i;
  int count_local;
  flatbuffers_voffset_t *required_local;
  flatcc_builder_t *B_local;
  
  if (B->frame->type != 3) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x526,
                  "int flatcc_builder_check_required(flatcc_builder_t *, const flatbuffers_voffset_t *, int)"
                 );
  }
  if ((int)(uint)B->id_end < count) {
    B_local._4_4_ = 0;
  }
  else {
    for (local_28 = 0; local_28 < count; local_28 = local_28 + 1) {
      if (B->vs[required[local_28]] == 0) {
        return 0;
      }
    }
    B_local._4_4_ = 1;
  }
  return B_local._4_4_;
}

Assistant:

int flatcc_builder_check_required(flatcc_builder_t *B, const flatbuffers_voffset_t *required, int count)
{
    int i;

    check(frame(type) == flatcc_builder_table, "expected table frame");

    if (B->id_end < count) {
        return 0;
    }
    for (i = 0; i < count; ++i) {
        if (B->vs[required[i]] == 0) {
            return 0;
        }
    }
    return 1;
}